

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

optional<pbrt::LightLeSample> * __thiscall
pbrt::PortalImageInfiniteLight::SampleLe
          (optional<pbrt::LightLeSample> *__return_storage_ptr__,PortalImageInfiniteLight *this,
          Point2f u1,Point2f u2,SampledWavelengths *lambda,Float time)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar10;
  undefined1 auVar5 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined8 uVar11;
  undefined1 auVar9 [64];
  undefined1 auVar13 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  Vector3f VVar17;
  Point3<float> PVar18;
  SampledSpectrum SVar19;
  Float mapPDF;
  Float duv_dw;
  Bounds2f b;
  Frame wFrame;
  float local_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [8];
  float fStack_170;
  float fStack_16c;
  Tuple2<pbrt::Point2,_float> local_168;
  float local_15c;
  float local_158;
  uint uStack_154;
  undefined4 uStack_150;
  uint uStack_14c;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  Tuple2<pbrt::Point2,_float> local_108;
  Bounds2<float> local_100;
  Frame local_f0;
  LightLeSample local_c8;
  undefined1 extraout_var [56];
  undefined1 auVar12 [56];
  undefined1 auVar16 [56];
  
  uVar10 = local_c8.L.values.values._0_8_;
  auVar14._8_56_ = in_register_00001248;
  auVar14._0_8_ = u2.super_Tuple2<pbrt::Point2,_float>;
  auVar6._8_56_ = in_register_00001208;
  auVar6._0_8_ = u1.super_Tuple2<pbrt::Point2,_float>;
  local_168 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar14._0_16_);
  auVar13._8_4_ = 0x3f800000;
  auVar13._0_8_ = 0x3f8000003f800000;
  auVar13._12_4_ = 0x3f800000;
  local_c8.L.values.values[0] = 0.0;
  local_c8.L.values.values[1] = 0.0;
  local_c8.L.values.values[3] = SUB84(uVar10,4);
  local_108 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar6._0_16_);
  local_f0.x.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar13);
  Bounds2<float>::Bounds2(&local_100,(Point2<float> *)&local_c8,(Point2<float> *)&local_f0);
  auVar7._0_8_ = WindowedPiecewiseConstant2D::Sample
                           (&this->distribution,(Point2f *)&local_108,&local_100,&local_19c);
  auVar7._8_56_ = extraout_var;
  fStack_184 = 0.0;
  fStack_17c = 0.0;
  if ((local_19c != 0.0) || (NAN(local_19c))) {
    local_118 = auVar7._0_16_;
    auVar12 = extraout_var;
    VVar17 = RenderFromImage(this,auVar7._0_8_,&local_15c);
    local_188 = VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar8._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar8._8_56_ = auVar12;
    _local_178 = auVar8._0_16_;
    if ((local_15c != 0.0) || (NAN(local_15c))) {
      local_128 = ZEXT416((uint)local_15c);
      fStack_180 = 0.0;
      local_148._0_8_ = auVar8._0_8_ ^ 0x8000000080000000;
      local_148._8_4_ = auVar12._0_4_ ^ 0x80000000;
      local_148._12_4_ = auVar12._4_4_ ^ 0x80000000;
      local_158 = -local_188;
      uStack_154 = (uint)fStack_184 ^ 0x80000000;
      uStack_14c = (uint)fStack_17c ^ 0x80000000;
      uStack_150 = 0x80000000;
      auVar4._8_4_ = 0x3f800000;
      auVar4._0_8_ = 0x3f8000003f800000;
      auVar4._12_4_ = 0x3f800000;
      local_138 = vinsertps_avx(auVar4,ZEXT416((uint)local_19c),0x10);
      Frame::FromZ(&local_f0,VVar17);
      VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
           SampleUniformDiskConcentric((Point2f *)&local_168);
      local_198 = this->sceneRadius;
      VVar17.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
      uVar10 = extraout_XMM0_Qb;
      fStack_194 = local_198;
      fStack_190 = local_198;
      fStack_18c = local_198;
      VVar17 = Frame::FromLocal(&local_f0,VVar17);
      auVar5._0_4_ = local_198 * VVar17.super_Tuple3<pbrt::Vector3,_float>.x;
      auVar5._4_4_ = fStack_194 * VVar17.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar5._8_4_ = fStack_190 * (float)uVar10;
      auVar5._12_4_ = fStack_18c * (float)((ulong)uVar10 >> 0x20);
      uVar11 = auVar5._8_8_;
      auVar16 = (undefined1  [56])0x0;
      uVar10 = vmovlps_avx(auVar5);
      local_c8.L.values.values[2] = local_198 * VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
      local_c8.L.values.values[0] = (float)(int)uVar10;
      local_c8.L.values.values[1] = (float)(int)((ulong)uVar10 >> 0x20);
      PVar18 = Point3<float>::operator+(&this->sceneCenter,(Vector3<float> *)&local_c8);
      fVar1 = this->sceneRadius;
      fVar2 = fVar1 * local_188;
      local_188 = PVar18.super_Tuple3<pbrt::Point3,_float>.x + fVar1 * (float)local_178._0_4_;
      fStack_184 = PVar18.super_Tuple3<pbrt::Point3,_float>.y + fVar1 * (float)local_178._4_4_;
      fStack_180 = (float)uVar11 + fVar1 * fStack_170;
      fStack_17c = (float)((ulong)uVar11 >> 0x20) + fVar1 * fStack_16c;
      local_198 = PVar18.super_Tuple3<pbrt::Point3,_float>.z + fVar2;
      _local_178 = ZEXT416((uint)(fVar1 * fVar1 * 3.1415927));
      auVar12 = ZEXT856((ulong)local_118._8_8_);
      SVar19 = ImageLookup(this,(Point2f)local_118._0_8_,lambda);
      auVar15._0_8_ = SVar19.values.values._8_8_;
      auVar15._8_56_ = auVar16;
      auVar9._0_8_ = SVar19.values.values._0_8_;
      auVar9._8_56_ = auVar12;
      local_c8.L.values.values = (array<float,_4>)vmovlhps_avx(auVar9._0_16_,auVar15._0_16_);
      auVar3._4_4_ = fStack_184;
      auVar3._0_4_ = local_188;
      auVar3._8_4_ = fStack_180;
      auVar3._12_4_ = fStack_17c;
      local_c8.ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar3);
      local_c8.ray.o.super_Tuple3<pbrt::Point3,_float>.z = local_198;
      local_c8.ray.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(local_148);
      local_c8.ray.d.super_Tuple3<pbrt::Vector3,_float>.z = local_158;
      local_c8.ray.medium.
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
      .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
               )0;
      local_c8.intr.set = false;
      auVar13 = vinsertps_avx(_local_178,ZEXT416((uint)local_128._0_4_),0x10);
      auVar13 = vdivps_avx(local_138,auVar13);
      local_c8._144_8_ = vmovlps_avx(auVar13);
      local_c8.ray.time = time;
      pstd::optional<pbrt::LightLeSample>::optional(__return_storage_ptr__,&local_c8);
      pstd::optional<pbrt::Interaction>::~optional(&local_c8.intr);
      return __return_storage_ptr__;
    }
  }
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = 0;
  *(undefined8 *)&__return_storage_ptr__->set = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = 0;
  (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightLeSample> PortalImageInfiniteLight::SampleLe(
    Point2f u1, Point2f u2, SampledWavelengths &lambda, Float time) const {
    Float mapPDF;
    Bounds2f b(Point2f(0, 0), Point2f(1, 1));
    Point2f uv = distribution.Sample(u1, b, &mapPDF);
    if (mapPDF == 0)
        return {};

    // Convert infinite light sample point to direction
    // Note: ignore WorldToLight since we already folded it in when we
    // resampled...
    Float duv_dw;
    Vector3f w = -RenderFromImage(uv, &duv_dw);
    if (duv_dw == 0)
        return {};

    // Compute PDF for sampled infinite light direction
    Float pdfDir = mapPDF / duv_dw;

#if 0
    // Just sample within the portal.
    // This works with the light path integrator, but not BDPT :-(
    Point3f p = portal[0] + u2[0] * (portal[1] - portal[0]) +
        u2[1] * (portal[3] - portal[0]);
    // Compute _PortalImageInfiniteLight_ ray PDFs
    Ray ray(p, w, time);

    // Cosine to account for projected area of portal w.r.t. ray direction.
    Normal3f n = Normal3f(portalFrame.z);
    Float pdfPos = 1 / (Area() * AbsDot(n, w));
#else
    // Compute infinite light sample ray
    Frame wFrame = Frame::FromZ(-w);
    Point2f cd = SampleUniformDiskConcentric(u2);
    Point3f pDisk = sceneCenter + sceneRadius * wFrame.FromLocal(Vector3f(cd.x, cd.y, 0));
    Ray ray(pDisk + sceneRadius * -w, w, time);

    Float pdfPos = 1 / (Pi * Sqr(sceneRadius));
#endif

    SampledSpectrum L = ImageLookup(uv, lambda);

    return LightLeSample(L, ray, pdfPos, pdfDir);
}